

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O2

istream * operator>>(istream *is,Graph<Node> *g)

{
  istream *piVar1;
  int i;
  int iVar2;
  int cost;
  int y;
  int x;
  int inputEdgeCnt;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  Edge local_3c;
  
  piVar1 = (istream *)std::istream::operator>>((istream *)is,&g->_nodeCnt);
  std::istream::operator>>(piVar1,&local_40);
  Graph<Node>::resize(g,g->_nodeCnt);
  for (iVar2 = 0; iVar2 < local_40; iVar2 = iVar2 + 1) {
    piVar1 = (istream *)std::istream::operator>>((istream *)is,&local_44);
    piVar1 = (istream *)std::istream::operator>>(piVar1,&local_48);
    std::istream::operator>>(piVar1,&local_4c);
    local_3c._nodeS = local_44;
    local_3c._nodeD = local_48;
    local_3c._cost = local_4c;
    Graph<Node>::addEdge(g,&local_3c);
  }
  return is;
}

Assistant:

std::istream &operator >> (std::istream &is, Graph <NodeT> &g) {
        int inputEdgeCnt;
        is >> g._nodeCnt >> inputEdgeCnt;
        g.resize(g._nodeCnt);
        for (int i = 0; i < inputEdgeCnt; ++i) {
            int x, y, cost;
            is >> x >> y >> cost;
            g.addEdge(Edge(x, y, cost));
        }
        return is;
    }